

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::GetOneofStoredType_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  Descriptor *this_00;
  char *pcVar1;
  Descriptor *descriptor;
  allocator local_2d [16];
  allocator local_1d;
  JavaType local_1c;
  java *pjStack_18;
  JavaType javaType;
  FieldDescriptor *field_local;
  
  pjStack_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  local_1c = GetJavaType((FieldDescriptor *)this);
  if (local_1c == JAVATYPE_ENUM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"java.lang.Integer",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else if (local_1c == JAVATYPE_MESSAGE) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)pjStack_18);
    ClassName_abi_cxx11_(__return_storage_ptr__,(java *)this_00,descriptor);
  }
  else {
    pcVar1 = BoxedPrimitiveTypeName(local_1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOneofStoredType(const FieldDescriptor* field) {
  const JavaType javaType = GetJavaType(field);
  switch (javaType) {
    case JAVATYPE_ENUM:
      return "java.lang.Integer";
    case JAVATYPE_MESSAGE:
      return ClassName(field->message_type());
    default:
      return BoxedPrimitiveTypeName(javaType);
  }
}